

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

void __thiscall
NDeviceChannel::serialize<cereal::PortableBinaryOutputArchive>
          (NDeviceChannel *this,PortableBinaryOutputArchive *archive)

{
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            ((OutputArchive<cereal::PortableBinaryOutputArchive,1u> *)archive,&this->id,
             &this->startByte,&this->startBit,&this->type,&this->interleavedDataByte,
             &this->interleavedDataBit);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, startByte, startBit, type, interleavedDataByte, interleavedDataBit);
    }